

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::WildcardPattern::normaliseString
          (string *__return_storage_ptr__,WildcardPattern *this,string *str)

{
  string sStack_28;
  
  if (this->m_caseSensitivity == No) {
    toLower(&sStack_28,str);
  }
  else {
    std::__cxx11::string::string((string *)&sStack_28,(string *)str);
  }
  trim(__return_storage_ptr__,&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  return __return_storage_ptr__;
}

Assistant:

std::string WildcardPattern::normaliseString( std::string const& str ) const {
        return trim( m_caseSensitivity == CaseSensitive::No ? toLower( str ) : str );
    }